

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O3

void __thiscall lsim::gui::CircuitEditor::draw_ui(CircuitEditor *this,UIContext *ui_context)

{
  Point *p;
  ComponentIcon *this_00;
  _Hash_node_base *p_Var1;
  ModelWire *this_01;
  SimCircuit *pSVar2;
  pointer pPVar3;
  ImVec2 IVar4;
  Transform transform;
  Transform transform_00;
  undefined1 p_00 [8];
  undefined1 auVar5 [16];
  CircuitEditor *pCVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  byte bVar9;
  bool bVar10;
  Value VVar11;
  node_t node_id;
  CircuitEditorState CVar12;
  ImDrawList *this_02;
  mapped_type *pmVar13;
  pin_id_t pVar14;
  Point *pPVar15;
  ModelWireSegment *segment;
  size_t sVar16;
  ImU32 IVar17;
  ImU32 col;
  _Hash_node_base *p_Var18;
  pointer ptr_id;
  Point PVar19;
  ComponentWidget *pCVar20;
  size_t sVar21;
  Point *anchor;
  pointer this_03;
  float fVar22;
  float fVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 uVar24;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dd_06;
  Point endpoint_screen;
  Point endpoint_circuit;
  Transform widget_to_screen;
  Point local_e8;
  Point local_e0;
  Transform local_d8;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  CircuitEditor *local_90;
  Point local_88;
  Point local_80;
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  pointer local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  float afStack_40 [2];
  float local_38 [2];
  
  this_02 = ImGui::GetWindowDrawList();
  local_d8.m_el[0] = (float  [2])ImGui::GetCursorScreenPos();
  IVar4 = ImGui::GetCursorScreenPos();
  Point::Point(&local_e0,IVar4.x,IVar4.y);
  IVar4 = ImGui::GetContentRegionMax();
  Point::Point(&local_88,IVar4.x,IVar4.y);
  local_e8 = Point::operator+(&local_e0,&local_88);
  ImGui::PushClipRect((ImVec2 *)&local_d8,(ImVec2 *)&local_e8,true);
  IVar4 = ImGui::GetCursorScreenPos();
  uStack_b0 = extraout_XMM0_Dc;
  local_b8._0_4_ = IVar4.x;
  local_b8._4_4_ = IVar4.y;
  uStack_ac = extraout_XMM0_Dd;
  IVar4 = ImGui::GetCursorScreenPos();
  Point::Point((Point *)&local_d8,IVar4.x,IVar4.y);
  IVar4 = ImGui::GetContentRegionMax();
  Point::Point(&local_e8,IVar4.x,IVar4.y);
  PVar19 = Point::operator+((Point *)&local_d8,&local_e8);
  ImDrawList::PushClipRect(this_02,(ImVec2)local_b8,(ImVec2)PVar19,true);
  if (this->m_state != CS_SIMULATING) {
    draw_grid(this,this_02);
  }
  ui_popup_embed_circuit(this);
  ui_popup_sub_circuit(this,ui_context);
  ui_popup_edit_segment(this);
  ImDrawList::ChannelsSplit(this_02,2);
  ptr_id = (this->m_widgets).
           super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (this->m_widgets).
             super__Vector_base<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>,_std::allocator<std::unique_ptr<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = this;
  if (ptr_id != local_60) {
    local_b8 = (undefined1  [8])&this->m_screen_offset;
    local_78 = (undefined1  [8])&this->m_point_pin_lut;
    local_80 = (Point)&this->m_mouse_grid_point;
    do {
      ImGui::PushID(ptr_id);
      pCVar20 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      local_d8.m_el[2] = *(float (*) [2])((long)(pCVar20->m_to_circuit).m_el + 0x10);
      local_d8.m_el[0] = (pCVar20->m_to_circuit).m_el[0];
      local_d8.m_el[1] = *(float (*) [2])((long)(pCVar20->m_to_circuit).m_el + 8);
      p_00 = local_b8;
      Transform::translate(&local_d8,(Point *)local_b8);
      PVar19 = Point::operator+(&((ptr_id->_M_t).
                                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                                 _M_head_impl)->m_aabb_min,(Point *)p_00);
      local_a8._8_4_ = extraout_XMM0_Dc_00;
      local_a8._0_4_ = PVar19.x;
      local_a8._4_4_ = PVar19.y;
      local_a8._12_4_ = extraout_XMM0_Dd_00;
      PVar19 = Point::operator+(&((ptr_id->_M_t).
                                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>.
                                 _M_head_impl)->m_aabb_max,(Point *)p_00);
      auVar5 = local_a8;
      local_58._8_4_ = extraout_XMM0_Dc_01;
      local_58._0_4_ = PVar19.x;
      local_58._4_4_ = PVar19.y;
      local_58._12_4_ = extraout_XMM0_Dd_01;
      if (*(_Manager_type *)
           ((long)&(((ptr_id->_M_t).
                     super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                     .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl)->
                   m_draw_callback).super__Function_base + 0x10) != (_Manager_type)0x0) {
        local_e8.x = (float)local_a8._0_4_;
        local_e8.y = (float)local_a8._4_4_;
        local_a8 = auVar5;
        ImGui::SetCursorScreenPos((ImVec2 *)&local_e8);
        ImDrawList::ChannelsSetCurrent(this_02,1);
        transform.m_el[1][0] = local_d8.m_el[1][0];
        transform.m_el[1][1] = local_d8.m_el[1][1];
        transform.m_el[0][0] = local_d8.m_el[0][0];
        transform.m_el[0][1] = local_d8.m_el[0][1];
        transform.m_el[2][0] = local_d8.m_el[2][0];
        transform.m_el[2][1] = local_d8.m_el[2][1];
        ComponentWidget::run_draw_callback
                  ((ptr_id->_M_t).
                   super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                   .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl,this,
                   transform);
      }
      ImDrawList::ChannelsSetCurrent(this_02,0);
      auVar5 = local_a8;
      local_e8.x = (float)local_a8._0_4_;
      local_e8.y = (float)local_a8._4_4_;
      local_a8 = auVar5;
      ImGui::SetCursorScreenPos((ImVec2 *)&local_e8);
      pCVar20 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      local_e8 = Point::operator-(&pCVar20->m_aabb_max,&pCVar20->m_aabb_min);
      ImGui::InvisibleButton("widget",(ImVec2 *)&local_e8);
      pCVar20 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      if ((pCVar20->m_tooltip)._M_string_length != 0) {
        bVar8 = ImGui::IsItemHovered(0);
        pCVar20 = (ptr_id->_M_t).
                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
        if (bVar8) {
          ImGui::SetTooltip("%s",(pCVar20->m_tooltip)._M_dataplus._M_p);
          pCVar20 = (ptr_id->_M_t).
                    super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                    .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
        }
      }
      bVar8 = is_selected(this,pCVar20);
      auVar7 = local_58;
      auVar5 = local_a8;
      IVar17 = 0xffc8c8c8;
      if (bVar8) {
        local_e8.x = (float)local_a8._0_4_;
        local_e8.y = (float)local_a8._4_4_;
        local_e0.x = (float)local_58._0_4_;
        local_e0.y = (float)local_58._4_4_;
        local_a8 = auVar5;
        local_58 = auVar7;
        ImDrawList::AddRectFilled
                  (this_02,(ImVec2 *)&local_e8,(ImVec2 *)&local_e0,0xff006464,0.0,0xf);
        IVar17 = 0xffc8c8c8;
        if (this->m_state == CS_DRAGGING) {
          IVar17 = 0xff646464;
        }
        pCVar20 = (ptr_id->_M_t).
                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      }
      auVar7 = local_58;
      auVar5 = local_a8;
      bVar9 = pCVar20->m_border;
      if ((bool)bVar9 == true) {
        local_e8.x = (float)local_a8._0_4_;
        local_e8.y = (float)local_a8._4_4_;
        local_e0.x = (float)local_58._0_4_;
        local_e0.y = (float)local_58._4_4_;
        local_a8 = auVar5;
        local_58 = auVar7;
        ImDrawList::AddRect(this_02,(ImVec2 *)&local_e8,(ImVec2 *)&local_e0,IVar17,0.0,0xf,1.0);
        pCVar20 = (ptr_id->_M_t).
                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
        bVar9 = pCVar20->m_border;
      }
      if (((bVar9 & 1) != 0) && (this_00 = pCVar20->m_icon, this_00 != (ComponentIcon *)0x0)) {
        local_38[0] = local_d8.m_el[2][0];
        local_38[1] = local_d8.m_el[2][1];
        local_48.x = local_d8.m_el[0][0];
        local_48.y = local_d8.m_el[0][1];
        afStack_40[0] = local_d8.m_el[1][0];
        afStack_40[1] = local_d8.m_el[1][1];
        pCVar20 = (ptr_id->_M_t).
                  super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                  .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
        local_e8 = Point::operator-(&pCVar20->m_aabb_max,&pCVar20->m_aabb_min);
        Point::Point(&local_e0,10.0,10.0);
        PVar19 = Point::operator-(&local_e8,&local_e0);
        transform_00.m_el[1][0] = afStack_40[0];
        transform_00.m_el[1][1] = afStack_40[1];
        transform_00.m_el[0][0] = local_48.x;
        transform_00.m_el[0][1] = local_48.y;
        transform_00.m_el[2][0] = local_38[0];
        transform_00.m_el[2][1] = local_38[1];
        ComponentIcon::draw(this_00,transform_00,PVar19,this_02,2,0xffc8c8c8);
      }
      bVar8 = ImGui::IsItemHovered(0);
      local_a8._0_8_ = ptr_id;
      pCVar20 = (ptr_id->_M_t).
                super___uniq_ptr_impl<lsim::gui::ComponentWidget,_std::default_delete<lsim::gui::ComponentWidget>_>
                ._M_t.
                super__Tuple_impl<0UL,_lsim::gui::ComponentWidget_*,_std::default_delete<lsim::gui::ComponentWidget>_>
                .super__Head_base<0UL,_lsim::gui::ComponentWidget_*,_false>._M_head_impl;
      if (bVar8) {
        this->m_hovered_widget = pCVar20;
      }
      for (p_Var18 = ((__node_base *)((long)&(pCVar20->m_endpoints)._M_h + 0x10))->_M_nxt;
          p_Var18 != (_Hash_node_base *)0x0; p_Var18 = p_Var18->_M_nxt) {
        local_e8 = Transform::apply(&local_d8,(Point *)(p_Var18 + 2));
        local_e0 = Point::operator-(&local_e8,(Point *)local_b8);
        IVar17 = 0xff969696;
        if (this->m_state == CS_SIMULATING) {
          VVar11 = SimCircuit::pin_output(this->m_sim_circuit,(pin_id_t)p_Var18[1]._M_nxt);
          IVar17 = COLOR_CONNECTION[VVar11];
        }
        p_Var1 = p_Var18[1]._M_nxt;
        pmVar13 = std::__detail::
                  _Map_base<lsim::Point,_std::pair<const_lsim::Point,_unsigned_long>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<lsim::Point>,_lsim::gui::CircuitEditor::PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<lsim::Point,_std::pair<const_lsim::Point,_unsigned_long>,_std::allocator<std::pair<const_lsim::Point,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<lsim::Point>,_lsim::gui::CircuitEditor::PointHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_78,&local_e0);
        this = local_90;
        *pmVar13 = (mapped_type)p_Var1;
        local_88 = local_e8;
        ImDrawList::AddCircleFilled(this_02,(ImVec2 *)&local_88,3.0,IVar17,0xc);
        fVar22 = distance_squared((Point *)local_80,&local_e0);
        if (fVar22 <= 2.0) {
          local_88 = local_e8;
          ImDrawList::AddCircle(this_02,(ImVec2 *)&local_88,8.0,0xc800ffff,0xc,2.0);
          this->m_hovered_pin = (pin_id_t)p_Var18[1]._M_nxt;
        }
      }
      ImGui::PopID();
      ptr_id = (pointer)(local_a8._0_8_ + 8);
    } while (ptr_id != local_60);
  }
  PVar19 = (Point)(this->m_model_circuit->m_wires)._M_h._M_before_begin._M_nxt;
  if (PVar19 != (Point)0x0) {
    p = &this->m_screen_offset;
    local_a8._0_8_ = &this->m_mouse_grid_point;
    do {
      pCVar6 = local_90;
      this_01 = (ModelWire *)((_Hash_node_base *)((long)PVar19 + 0x10))->_M_nxt;
      IVar17 = 0xff787878;
      local_80 = PVar19;
      if ((this->m_state == CS_SIMULATING) &&
         ((this_01->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (this_01->m_pins).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start)) {
        pSVar2 = local_90->m_sim_circuit;
        pVar14 = ModelWire::pin(this_01,0);
        VVar11 = SimCircuit::read_pin(pSVar2,pVar14);
        IVar17 = COLOR_CONNECTION[VVar11];
        pSVar2 = pCVar6->m_sim_circuit;
        pVar14 = ModelWire::pin(this_01,0);
        node_id = SimCircuit::pin_node(pSVar2,pVar14);
        bVar8 = SimCircuit::node_dirty(pCVar6->m_sim_circuit,node_id);
      }
      else {
        bVar8 = false;
      }
      if ((this_01->m_segments).
          super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_01->m_segments).
          super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar21 = 0;
        do {
          pPVar15 = ModelWire::segment_point(this_01,sVar21,0);
          PVar19 = Point::operator+(pPVar15,p);
          uStack_b0 = extraout_XMM0_Dc_02;
          local_b8._0_4_ = PVar19.x;
          local_b8._4_4_ = PVar19.y;
          uStack_ac = extraout_XMM0_Dd_02;
          pPVar15 = ModelWire::segment_point(this_01,sVar21,1);
          PVar19 = Point::operator+(pPVar15,p);
          auVar5 = _local_b8;
          uStack_70 = extraout_XMM0_Dc_03;
          local_78._0_4_ = PVar19.x;
          local_78._4_4_ = PVar19.y;
          uStack_6c = extraout_XMM0_Dd_03;
          if (bVar8 != false) {
            local_d8.m_el[0][0] = (float)local_b8._0_4_;
            local_d8.m_el[0][1] = (float)local_b8._4_4_;
            local_e8 = PVar19;
            _local_b8 = auVar5;
            ImDrawList::AddLine(this_02,(ImVec2 *)&local_d8,(ImVec2 *)&local_e8,0xaf969696,4.0);
          }
          segment = ModelWire::segment_by_index(this_01,sVar21);
          bVar10 = is_selected(local_90,segment);
          auVar7 = _local_78;
          auVar5 = _local_b8;
          col = IVar17;
          if (bVar10) {
            col = 0xff006464;
          }
          local_d8.m_el[0][0] = (float)local_b8._0_4_;
          local_d8.m_el[0][1] = (float)local_b8._4_4_;
          local_e8.x = (float)local_78._0_4_;
          local_e8.y = (float)local_78._4_4_;
          _local_b8 = auVar5;
          _local_78 = auVar7;
          ImDrawList::AddLine(this_02,(ImVec2 *)&local_d8,(ImVec2 *)&local_e8,col,2.0);
          sVar21 = sVar21 + 1;
        } while (sVar21 < (ulong)((long)(this_01->m_segments).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_01->m_segments).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      PVar19 = local_80;
      if ((this_01->m_junctions).
          super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_01->m_junctions).
          super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar21 = 0;
        do {
          sVar16 = ModelWire::junction_segment_count(this_01,sVar21);
          if (2 < sVar16) {
            pPVar15 = ModelWire::junction_position(this_01,sVar21);
            local_d8.m_el[0] = (float  [2])Point::operator+(pPVar15,p);
            ImDrawList::AddCircleFilled(this_02,(ImVec2 *)&local_d8,4.0,IVar17,0xc);
          }
          sVar21 = sVar21 + 1;
        } while (sVar21 < (ulong)((long)(this_01->m_junctions).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_01->m_junctions).
                                        super__Vector_base<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>,_std::allocator<std::unique_ptr<lsim::ModelWireJunction,_std::default_delete<lsim::ModelWireJunction>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      this = local_90;
      if (local_90->m_hovered_wire == (ModelWire *)0x0) {
        bVar8 = ModelWire::point_on_wire(this_01,(Point *)local_a8._0_8_);
        if (bVar8) {
          local_d8.m_el[0] = (float  [2])Point::operator+((Point *)local_a8._0_8_,p);
          ImDrawList::AddCircle(this_02,(ImVec2 *)&local_d8,8.0,0xc800ffff,0xc,2.0);
          this->m_hovered_wire = this_01;
        }
      }
      PVar19 = *(Point *)PVar19;
    } while (PVar19 != (Point)0x0);
  }
  CVar12 = this->m_state;
  if (CVar12 == CS_AREA_SELECT) {
    PVar19 = Point::operator+(&this->m_area_sel_a,&this->m_screen_offset);
    uStack_b0 = extraout_XMM0_Dc_04;
    local_b8._0_4_ = PVar19.x;
    local_b8._4_4_ = PVar19.y;
    uStack_ac = extraout_XMM0_Dd_04;
    PVar19 = Point::operator+(&this->m_mouse_grid_point,&this->m_screen_offset);
    ImGuiEx::RectFilled((ImVec2)local_b8,(ImVec2)PVar19,0x80800000);
    CVar12 = this->m_state;
  }
  if (CVar12 == CS_CREATE_WIRE) {
    (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
    super__Vector_impl_data._M_finish[-1] = this->m_mouse_grid_point;
    PVar19 = Point::operator+((this->m_line_anchors).
                              super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>._M_impl.
                              super__Vector_impl_data._M_start,&this->m_screen_offset);
    this_03 = (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar3 = (this->m_line_anchors).super__Vector_base<lsim::Point,_std::allocator<lsim::Point>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (this_03 != pPVar3) {
      fVar22 = PVar19.x;
      fVar23 = PVar19.y;
      uVar24 = extraout_XMM0_Dc_05;
      uVar25 = extraout_XMM0_Dd_05;
      do {
        local_78._4_4_ = fVar23;
        local_78._0_4_ = fVar22;
        uStack_70 = uVar24;
        uStack_6c = uVar25;
        local_e8 = Point::operator+(this_03,&this->m_screen_offset);
        auVar5 = _local_78;
        uStack_b0 = extraout_XMM0_Dc_06;
        local_b8._0_4_ = local_e8.x;
        local_b8._4_4_ = local_e8.y;
        uStack_ac = extraout_XMM0_Dd_06;
        local_d8.m_el[0][0] = (float)local_78._0_4_;
        local_d8.m_el[0][1] = (float)local_78._4_4_;
        _local_78 = auVar5;
        ImDrawList::AddLine(this_02,(ImVec2 *)&local_d8,(ImVec2 *)&local_e8,0xffff0000,4.0);
        this_03 = this_03 + 1;
        fVar22 = (float)local_b8._0_4_;
        fVar23 = (float)local_b8._4_4_;
        uVar24 = uStack_b0;
        uVar25 = uStack_ac;
      } while (this_03 != pPVar3);
    }
  }
  ImDrawList::ChannelsMerge(this_02);
  ImGui::PopClipRect();
  ImDrawList::PopClipRect(this_02);
  return;
}

Assistant:

void CircuitEditor::draw_ui(UIContext *ui_context) {

	auto draw_list = ImGui::GetWindowDrawList();
	
	// clipping
	ImGui::PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);
	draw_list->PushClipRect(ImGui::GetCursorScreenPos(), Point(ImGui::GetCursorScreenPos()) + ImGui::GetContentRegionMax(), true);

	// grid
	if (!is_simulating()) {
		draw_grid(draw_list);
	}

	// potential popup windows
	ui_popup_embed_circuit();
	ui_popup_sub_circuit(ui_context);
	ui_popup_edit_segment();
	
	// create two layers to draw the background and the widgets
	draw_list->ChannelsSplit(2);

	// draw all widgets
	for (auto &widget : m_widgets) {

		ImGui::PushID(&widget);
		
		// setup
		Transform widget_to_screen = widget->to_circuit();
		widget_to_screen.translate(m_screen_offset);

		const auto widget_aabb_min = widget->aabb_min() + m_screen_offset;
		const auto widget_aabb_max = widget->aabb_max() + m_screen_offset;

		// custom draw routine
		if (widget->has_draw_callback()) {
			ImGui::SetCursorScreenPos(widget_aabb_min);
			draw_list->ChannelsSetCurrent(1);
			widget->run_draw_callback(this, widget_to_screen);
		}
	
		// invisible button used for widget selection
		draw_list->ChannelsSetCurrent(0);         // background
		ImGui::SetCursorScreenPos(widget_aabb_min);
		ImGui::InvisibleButton("widget", widget->aabb_size());

		// tooltip
		if (widget->has_tooltip() && ImGui::IsItemHovered()) {
			ImGui::SetTooltip("%s", widget->tooltip());
		}

		// draw border
		auto border_color = COLOR_COMPONENT_BORDER;

		if (is_selected(widget.get())) {
			draw_list->AddRectFilled(widget_aabb_min, widget_aabb_max, COLOR_COMPONENT_SELECTED);
			if (m_state == CS_DRAGGING) {
				border_color = COLOR_COMPONENT_BORDER_DRAGGING;
			}
		}

		if (widget->has_border()) {
  		  	draw_list->AddRect(widget_aabb_min, widget_aabb_max, border_color);
		}

		// draw icon
		if (widget->has_border() && widget->icon() != nullptr) {
    		widget->icon()->draw(widget_to_screen, widget->aabb_size() - Point(10,10), 
							   draw_list, 2, COLOR_COMPONENT_ICON);
		}

		// check for mouse hover
		if (ImGui::IsItemHovered()) {
			m_hovered_widget = widget.get();
		}

		// end points
		for (const auto &pair : widget->endpoints()) {
			// pair.first = pin-id ; pair.second = position
			auto endpoint_screen = widget_to_screen.apply(pair.second);
			auto endpoint_circuit = endpoint_screen - m_screen_offset;

			auto pin_color = COLOR_ENDPOINT;
			if (is_simulating()) {
				pin_color = COLOR_CONNECTION[m_sim_circuit->pin_output(pair.first)];
			}

			m_point_pin_lut[endpoint_circuit] = pair.first;

			draw_list->AddCircleFilled(endpoint_screen, 3, pin_color);

			if (distance_squared(m_mouse_grid_point, endpoint_circuit) <= 2) {
				draw_list->AddCircle(endpoint_screen, 8, COLOR_ENDPOINT_HOVER, 12, 2);
				m_hovered_pin = pair.first;
			}
		}

		ImGui::PopID();
	}

	// draw wires
	for (const auto &wire_it : m_model_circuit->wires()) {
		auto wire = wire_it.second.get();
		auto wire_color = COLOR_CONNECTION_UNDEFINED;
		bool dirty_node = false;

		// check color & highlight when simulation is running
		if (is_simulating() && wire->num_pins() > 0) {
			auto value = m_sim_circuit->read_pin(wire->pin(0));
			wire_color = COLOR_CONNECTION[value];

			auto node_id = m_sim_circuit->pin_node(wire->pin(0));
			dirty_node = m_sim_circuit->node_dirty(node_id);
		}

		// segments
		for (size_t idx = 0; idx < wire->num_segments(); ++idx) {
			const auto p0 = wire->segment_point(idx, 0) + m_screen_offset;
			const auto p1 = wire->segment_point(idx, 1) + m_screen_offset;

			if (dirty_node) {
				draw_list->AddLine(p0, p1, COLOR_CONNECTION_DIRTY, 4.0f);
			}

			auto segment_color = is_selected(wire->segment_by_index(idx)) ? COLOR_WIRE_SELECTED : wire_color;
			draw_list->AddLine(p0, p1, segment_color, 2.0f);
		}

		// draw junctions with more than 2 segments
		for (size_t idx = 0; idx < wire->num_junctions(); ++idx) {
			if (wire->junction_segment_count(idx) > 2) {
				draw_list->AddCircleFilled(wire->junction_position(idx) + m_screen_offset, 4, wire_color);
			}
		}
		
		// check for hovered wire
		if (m_hovered_wire == nullptr && wire->point_on_wire(m_mouse_grid_point)) {
			draw_list->AddCircle(m_mouse_grid_point + m_screen_offset, 8, COLOR_ENDPOINT_HOVER, 12, 2);
			m_hovered_wire = wire;
		}
	} 

	// draw area selection box
	if (m_state == CS_AREA_SELECT) {
		ImGuiEx::RectFilled(m_area_sel_a + m_screen_offset, m_mouse_grid_point + m_screen_offset, 
							IM_COL32(0, 0, 128, 128));
	}

	// draw wire under construction
	if (m_state == CS_CREATE_WIRE) {
		m_line_anchors.back() = m_mouse_grid_point;
		Point p0 = m_line_anchors.front() + m_screen_offset;

		for (const auto &anchor : m_line_anchors) {
			Point p1 = anchor + m_screen_offset;
			draw_list->AddLine(p0, p1, IM_COL32(0, 0, 255, 255), 4);
			p0 = p1;
		}
	}

	draw_list->ChannelsMerge();
	ImGui::PopClipRect();
	draw_list->PopClipRect();
}